

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::AddIncludeDirectory(cmGeneratorTarget *this,string *src,bool before)

{
  cmTarget *this_00;
  pointer pcVar1;
  const_iterator __position;
  TargetPropertyEntryVector *pTVar2;
  cmake *propertyValue;
  pointer *__ptr;
  undefined1 local_c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  _Base_ptr local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  _Base_ptr local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [56];
  _Alloc_hider _Stack_48;
  element_type *local_40;
  undefined8 uStack_38;
  
  this_00 = this->Target;
  pcVar1 = (src->_M_dataplus)._M_p;
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + src->_M_string_length);
  cmMakefile::GetBacktrace(this->Makefile);
  if (local_a0 == &local_90) {
    local_80._24_8_ = local_90._8_8_;
    local_80._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_80 + 0x10);
  }
  else {
    local_80._0_8_ = local_a0;
  }
  local_80._17_7_ = local_90._M_allocated_capacity._1_7_;
  local_80[0x10] = local_90._M_local_buf[0];
  local_80._8_8_ = local_98;
  local_98 = (_Base_ptr)0x0;
  local_90._M_local_buf[0] = _S_red;
  local_80._32_8_ = local_40;
  local_80._40_8_ = uStack_38;
  local_40 = (element_type *)0x0;
  uStack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a0 = &local_90;
  cmTarget::InsertInclude
            (this_00,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_80,before);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._40_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_38 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_38);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  pTVar2 = (TargetPropertyEntryVector *)
           &(this->IncludeDirectoriesEntries).
            super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (before) {
    pTVar2 = &this->IncludeDirectoriesEntries;
  }
  __position._M_current =
       (pTVar2->
       super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  propertyValue = cmMakefile::GetCMakeInstance(this->Makefile);
  pcVar1 = (src->_M_dataplus)._M_p;
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + src->_M_string_length);
  cmMakefile::GetBacktrace(this->Makefile);
  local_80._0_8_ = local_80 + 0x10;
  if (local_c0 == &local_b0) {
    local_80._24_8_ = local_b0._8_8_;
  }
  else {
    local_80._0_8_ = local_c0;
  }
  local_80._17_7_ = local_b0._M_allocated_capacity._1_7_;
  local_80[0x10] = local_b0._M_local_buf[0];
  local_80._8_8_ = local_b8;
  local_b8 = (_Base_ptr)0x0;
  local_b0._M_local_buf[0] = '\0';
  local_80._32_8_ = local_80._48_8_;
  local_80._40_8_ = _Stack_48._M_p;
  local_80._48_8_ = 0;
  _Stack_48._M_p = (pointer)0x0;
  local_c0 = &local_b0;
  CreateTargetPropertyEntry
            ((cmake *)local_c8,
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )propertyValue,(bool)((char)&local_90 + '\x10'));
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::_M_insert_rval(&this->IncludeDirectoriesEntries,__position,(value_type *)local_c8);
  if ((tuple<cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
       )local_c8 != (_Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>)0x0) {
    (**(code **)((long)*(__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                         *)local_c8 + 8))();
  }
  local_c8 = (undefined1  [8])0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._40_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_48._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_48._M_p);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::AddIncludeDirectory(const std::string& src,
                                            bool before)
{
  this->Target->InsertInclude(
    BT<std::string>(src, this->Makefile->GetBacktrace()), before);
  this->IncludeDirectoriesEntries.insert(
    before ? this->IncludeDirectoriesEntries.begin()
           : this->IncludeDirectoriesEntries.end(),
    CreateTargetPropertyEntry(
      *this->Makefile->GetCMakeInstance(),
      BT<std::string>(src, this->Makefile->GetBacktrace()), true));
}